

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_TriangleStripSet(X3DImporter *this)

{
  size_t *psVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  FIReader *pFVar4;
  char *pcVar5;
  CX3DImporter_NodeElement *pCVar6;
  iterator iVar7;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar8;
  CX3DImporter_NodeElement *pCVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var14;
  int *piVar15;
  runtime_error *prVar16;
  string *psVar17;
  byte bVar18;
  long lVar19;
  byte bVar20;
  ulong uVar21;
  long lVar22;
  byte bVar23;
  int iVar24;
  char *__end;
  long lVar25;
  string an;
  CX3DImporter_NodeElement *ne;
  vector<int,_std::allocator<int>_> stripCount;
  string def;
  string use;
  bool local_d9;
  string local_d0;
  vector<int,_std::allocator<int>_> *local_b0;
  CX3DImporter_NodeElement *local_a8;
  allocator local_99;
  long local_98;
  int *local_90;
  vector<int,_std::allocator<int>_> local_88;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_a8 = (CX3DImporter_NodeElement *)0x0;
  uVar11 = (*(((this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
             super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar11 < 1) {
    bVar20 = 1;
    bVar23 = 1;
    bVar18 = 1;
    local_d9 = true;
  }
  else {
    uVar21 = 0;
    local_d9 = true;
    local_b0 = (vector<int,_std::allocator<int>_> *)CONCAT71(local_b0._1_7_,1);
    local_90 = (int *)CONCAT71(local_90._1_7_,1);
    local_98 = CONCAT71(local_98._1_7_,1);
    do {
      pFVar4 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar13 = (int)uVar21;
      iVar12 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                         (pFVar4,uVar21);
      std::__cxx11::string::string
                ((string *)&local_d0,(char *)CONCAT44(extraout_var,iVar12),&local_99);
      iVar12 = std::__cxx11::string::compare((char *)&local_d0);
      if (iVar12 == 0) {
        iVar12 = (*(((this->mReader)._M_t.
                     super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                     .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                   super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar12);
        psVar17 = &local_70;
LAB_0074e0c4:
        pcVar5 = (char *)psVar17->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar17,0,pcVar5,(ulong)__s);
      }
      else {
        iVar12 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar12 == 0) {
          iVar12 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar12);
          psVar17 = &local_50;
          goto LAB_0074e0c4;
        }
        iVar12 = std::__cxx11::string::compare((char *)&local_d0);
        if (((iVar12 != 0) &&
            (iVar12 = std::__cxx11::string::compare((char *)&local_d0), iVar12 != 0)) &&
           (iVar12 = std::__cxx11::string::compare((char *)&local_d0), iVar12 != 0)) {
          iVar12 = std::__cxx11::string::compare((char *)&local_d0);
          if (iVar12 == 0) {
            local_d9 = XML_ReadNode_GetAttrVal_AsBool(this,iVar13);
          }
          else {
            iVar12 = std::__cxx11::string::compare((char *)&local_d0);
            if (iVar12 == 0) {
              bVar10 = XML_ReadNode_GetAttrVal_AsBool(this,iVar13);
              local_b0 = (vector<int,_std::allocator<int>_> *)CONCAT71(local_b0._1_7_,bVar10);
            }
            else {
              iVar12 = std::__cxx11::string::compare((char *)&local_d0);
              if (iVar12 == 0) {
                XML_ReadNode_GetAttrVal_AsArrI32(this,iVar13,&local_88);
              }
              else {
                iVar12 = std::__cxx11::string::compare((char *)&local_d0);
                if (iVar12 == 0) {
                  bVar10 = XML_ReadNode_GetAttrVal_AsBool(this,iVar13);
                  local_98 = CONCAT71(local_98._1_7_,bVar10);
                }
                else {
                  iVar12 = std::__cxx11::string::compare((char *)&local_d0);
                  if (iVar12 == 0) {
                    bVar10 = XML_ReadNode_GetAttrVal_AsBool(this,iVar13);
                    local_90 = (int *)CONCAT71(local_90._1_7_,bVar10);
                  }
                  else {
                    Throw_IncorrectAttr(this,&local_d0);
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      uVar21 = (ulong)(iVar13 + 1U);
    } while (uVar11 != iVar13 + 1U);
    bVar18 = (byte)local_b0 & 1;
    bVar20 = (byte)local_98 & 1;
    bVar23 = (byte)local_90 & 1;
  }
  if (local_50._M_string_length == 0) {
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,
                 "TriangleStripSet must contain not empty \"stripCount\" attribute.","");
      std::runtime_error::runtime_error(prVar16,(string *)&local_d0);
      *(undefined ***)prVar16 = &PTR__runtime_error_00900168;
      __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_a8 = (CX3DImporter_NodeElement *)operator_new(0xd8);
    pCVar6 = this->NodeElement_Cur;
    local_a8->Type = ENET_TriangleStripSet;
    (local_a8->ID)._M_dataplus._M_p = (pointer)&(local_a8->ID).field_2;
    (local_a8->ID)._M_string_length = 0;
    (local_a8->ID).field_2._M_local_buf[0] = '\0';
    local_a8->Parent = pCVar6;
    (local_a8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8->Child;
    (local_a8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8->Child;
    (local_a8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_a8[1]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&local_a8[1].Type = 0;
    *(CX3DImporter_NodeElement **)&local_a8[1].Type = local_a8 + 1;
    local_a8[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_a8 + 1);
    local_a8[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_a8[1].ID._M_string_length = 0;
    local_a8[1].ID.field_2._M_local_buf[0] = '\x01';
    local_a8->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Set_009dc998;
    *(undefined8 *)((long)&local_a8[1].ID.field_2 + 8) = 0;
    local_a8[1].Parent = (CX3DImporter_NodeElement *)0x0;
    local_a8[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    local_a8[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    local_a8[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_a8[2]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&local_a8[2].Type = 0;
    local_a8[2].ID._M_dataplus._M_p = (pointer)0x0;
    local_a8[2].ID._M_string_length = 0;
    local_a8[2].ID.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&local_a8[2].ID.field_2 + 8) = 0;
    local_a8[2].Parent = (CX3DImporter_NodeElement *)0x0;
    if (local_70._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_a8->ID);
    }
    pCVar9 = local_a8;
    local_a8[1].ID.field_2._M_local_buf[1] = local_d9;
    local_a8[1].ID.field_2._M_local_buf[2] = bVar18;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)&local_a8[2].ID.field_2,&local_88);
    pCVar9[1].ID.field_2._M_local_buf[3] = bVar20;
    pCVar9[1].ID.field_2._M_local_buf[0] = bVar23;
    pCVar6 = *(CX3DImporter_NodeElement **)((long)&pCVar9[1].ID.field_2 + 8);
    if (pCVar9[1].Parent != pCVar6) {
      pCVar9[1].Parent = pCVar6;
    }
    piVar15 = *(int **)&pCVar9[2].ID.field_2;
    if (piVar15 != *(int **)((long)&pCVar9[2].ID.field_2 + 8)) {
      local_b0 = (vector<int,_std::allocator<int>_> *)
                 (&pCVar9[1].ID.field_2._M_allocated_capacity + 1);
      local_98 = 0;
      do {
        if (*piVar15 < 3) {
          prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,
                     "TriangleStripSet. stripCount shall be greater than or equal to three.","");
          std::runtime_error::runtime_error(prVar16,(string *)&local_d0);
          *(undefined ***)prVar16 = &PTR__runtime_error_00900168;
          __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if (2 < *piVar15) {
          lVar25 = local_98 + 1;
          bVar10 = true;
          lVar19 = 2;
          lVar22 = local_98;
          local_90 = piVar15;
          do {
            lVar2 = local_98 + lVar19;
            iVar13 = (int)lVar22;
            iVar24 = (int)lVar25;
            iVar12 = (int)lVar2;
            local_d0._M_dataplus._M_p._0_4_ = iVar13;
            if (local_d9 == false) {
              iVar7._M_current = (int *)pCVar9[1].Parent;
              if ((_List_node_base *)iVar7._M_current ==
                  pCVar9[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_b0,iVar7,(int *)&local_d0);
              }
              else {
                *iVar7._M_current = iVar13;
                pCVar9[1].Parent =
                     (CX3DImporter_NodeElement *)
                     ((long)&(pCVar9[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              }
              iVar7._M_current = (int *)pCVar9[1].Parent;
              if ((_List_node_base *)iVar7._M_current ==
                  pCVar9[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next) {
                local_d0._M_dataplus._M_p._0_4_ = iVar12;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_b0,iVar7,(int *)&local_d0);
              }
              else {
                *iVar7._M_current = iVar12;
                pCVar9[1].Parent =
                     (CX3DImporter_NodeElement *)
                     ((long)&(pCVar9[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              }
              local_d0._M_dataplus._M_p._0_4_ = iVar24;
              iVar7._M_current = (int *)pCVar9[1].Parent;
              if ((_List_node_base *)iVar7._M_current !=
                  pCVar9[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next) {
                *iVar7._M_current = iVar24;
                goto LAB_0074e45e;
              }
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_b0,iVar7,(int *)&local_d0);
            }
            else {
              iVar7._M_current = (int *)pCVar9[1].Parent;
              if ((_List_node_base *)iVar7._M_current ==
                  pCVar9[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_b0,iVar7,(int *)&local_d0);
              }
              else {
                *iVar7._M_current = iVar13;
                pCVar9[1].Parent =
                     (CX3DImporter_NodeElement *)
                     ((long)&(pCVar9[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              }
              iVar7._M_current = (int *)pCVar9[1].Parent;
              if ((_List_node_base *)iVar7._M_current ==
                  pCVar9[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next) {
                local_d0._M_dataplus._M_p._0_4_ = iVar24;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_b0,iVar7,(int *)&local_d0);
              }
              else {
                *iVar7._M_current = iVar24;
                pCVar9[1].Parent =
                     (CX3DImporter_NodeElement *)
                     ((long)&(pCVar9[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              }
              local_d0._M_dataplus._M_p._0_4_ = iVar12;
              iVar7._M_current = (int *)pCVar9[1].Parent;
              if ((_List_node_base *)iVar7._M_current ==
                  pCVar9[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_b0,iVar7,(int *)&local_d0);
              }
              else {
                *iVar7._M_current = iVar12;
LAB_0074e45e:
                pCVar9[1].Parent =
                     (CX3DImporter_NodeElement *)
                     ((long)&(pCVar9[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              }
            }
            local_d0._M_dataplus._M_p._0_4_ = 0xffffffff;
            iVar7._M_current = (int *)pCVar9[1].Parent;
            if ((_List_node_base *)iVar7._M_current ==
                pCVar9[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_next) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_b0,iVar7,(int *)&local_d0);
            }
            else {
              *iVar7._M_current = -1;
              pCVar9[1].Parent =
                   (CX3DImporter_NodeElement *)
                   ((long)&(pCVar9[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
            }
            if (!bVar10) {
              lVar25 = lVar2;
              lVar2 = lVar22;
            }
            lVar22 = lVar2;
            bVar10 = (bool)(bVar10 ^ 1);
            lVar19 = lVar19 + 1;
          } while ((int)lVar19 < *local_90);
          local_98 = local_98 + lVar19;
          piVar15 = local_90;
        }
        piVar15 = piVar15 + 1;
      } while (piVar15 != *(int **)((long)&pCVar9[2].ID.field_2 + 8));
    }
    iVar12 = (*(((this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
               super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar12 == '\0') {
      ParseHelper_Node_Enter(this,local_a8);
      paVar3 = &local_d0.field_2;
      do {
        do {
          while( true ) {
            iVar12 = (*(((this->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
            if ((char)iVar12 == '\0') goto LAB_0074e83c;
            iVar13 = (*(((this->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
            if (iVar13 != 1) break;
            local_d0._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Color","");
            (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
            iVar12 = std::__cxx11::string::compare((char *)&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != paVar3) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if (iVar12 == 0) {
              ParseNode_Rendering_Color(this);
            }
            else {
              local_d0._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ColorRGBA","");
              (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
              iVar12 = std::__cxx11::string::compare((char *)&local_d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != paVar3) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              if (iVar12 == 0) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                local_d0._M_dataplus._M_p = (pointer)paVar3;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Coordinate","")
                ;
                (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                iVar12 = std::__cxx11::string::compare((char *)&local_d0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != paVar3) {
                  operator_delete(local_d0._M_dataplus._M_p);
                }
                if (iVar12 == 0) {
                  ParseNode_Rendering_Coordinate(this);
                }
                else {
                  local_d0._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Normal","");
                  (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                  iVar12 = std::__cxx11::string::compare((char *)&local_d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d0._M_dataplus._M_p != paVar3) {
                    operator_delete(local_d0._M_dataplus._M_p);
                  }
                  if (iVar12 == 0) {
                    ParseNode_Rendering_Normal(this);
                  }
                  else {
                    local_d0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_d0,"TextureCoordinate","");
                    (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                    iVar12 = std::__cxx11::string::compare((char *)&local_d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p != paVar3) {
                      operator_delete(local_d0._M_dataplus._M_p);
                    }
                    if (iVar12 == 0) {
                      ParseNode_Texturing_TextureCoordinate(this);
                    }
                    else {
                      bVar10 = ParseHelper_CheckRead_X3DMetadataObject(this);
                      if (!bVar10) {
                        local_d0._M_dataplus._M_p = (pointer)paVar3;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_d0,"TriangleStripSet","");
                        XML_CheckNode_SkipUnsupported(this,&local_d0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d0._M_dataplus._M_p != paVar3) {
                          operator_delete(local_d0._M_dataplus._M_p);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar13 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        } while (iVar13 != 2);
        local_d0._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"TriangleStripSet","");
        (*(((this->mReader)._M_t.
            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
            super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
        iVar13 = std::__cxx11::string::compare((char *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar3) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      } while (iVar13 != 0);
      if ((char)iVar12 == '\0') {
LAB_0074e83c:
        local_d0._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"TriangleStripSet","");
        Throw_CloseNotFound(this,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar3) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
      ParseHelper_Node_Exit(this);
    }
    else {
      pCVar6 = this->NodeElement_Cur;
      p_Var14 = (_List_node_base *)operator_new(0x18);
      p_Var14[1]._M_next = (_List_node_base *)local_a8;
      std::__detail::_List_node_base::_M_hook(p_Var14);
      psVar1 = &(pCVar6->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var14 = (_List_node_base *)operator_new(0x18);
    p_Var14[1]._M_next = (_List_node_base *)local_a8;
    std::__detail::_List_node_base::_M_hook(p_Var14);
    plVar8 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_70._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar10 = FindNodeElement(this,&local_50,ENET_TriangleStripSet,&local_a8);
    if (!bVar10) {
      Throw_USE_NotFound(this,&local_50);
    }
    pCVar6 = this->NodeElement_Cur;
    p_Var14 = (_List_node_base *)operator_new(0x18);
    p_Var14[1]._M_next = (_List_node_base *)local_a8;
    std::__detail::_List_node_base::_M_hook(p_Var14);
    plVar8 = &pCVar6->Child;
  }
  psVar1 = &(plVar8->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_TriangleStripSet()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    std::vector<int32_t> stripCount;
    bool normalPerVertex = true;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("stripCount", stripCount, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_TriangleStripSet, ne);
	}
	else
	{
		// check data
		if(stripCount.size() == 0) throw DeadlyImportError("TriangleStripSet must contain not empty \"stripCount\" attribute.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Set(CX3DImporter_NodeElement::ENET_TriangleStripSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_Set& ne_alias = *((CX3DImporter_NodeElement_Set*)ne);

		ne_alias.CCW = ccw;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.VertexCount = stripCount;
		ne_alias.NormalPerVertex = normalPerVertex;
		ne_alias.Solid = solid;
		// create CoordIdx
		size_t coord_num0, coord_num1, coord_num2;// indices of current triangle
		bool odd_tri;// sequence of current triangle
		size_t coord_num_sb;// index of first point of strip

		ne_alias.CoordIndex.clear();
		coord_num_sb = 0;
		for(std::vector<int32_t>::const_iterator vc_it = ne_alias.VertexCount.begin(); vc_it != ne_alias.VertexCount.end(); ++vc_it)
		{
			if(*vc_it < 3) throw DeadlyImportError("TriangleStripSet. stripCount shall be greater than or equal to three.");

			// set initial values for first triangle
			coord_num0 = coord_num_sb;
			coord_num1 = coord_num_sb + 1;
			coord_num2 = coord_num_sb + 2;
			odd_tri = true;

			for(int32_t vc = 2; vc < *vc_it; vc++)
			{
				if(ccw)
				{
					// 0 2
					//  1
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num0));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num1));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num2));
				}
				else
				{
					// 0 1
					//  2
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num0));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num2));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num1));
				}// if(ccw) else

				ne_alias.CoordIndex.push_back(-1);// add face delimiter.
				// prepare values for next triangle
				if(odd_tri)
				{
					coord_num0 = coord_num2;
					coord_num2++;
				}
				else
				{
					coord_num1 = coord_num2;
					coord_num2 = coord_num1 + 1;
				}

				odd_tri = !odd_tri;
				coord_num_sb = coord_num2;// that index will be start of next strip
			}// for(int32_t vc = 2; vc < *vc_it; vc++)
		}// for(std::list<int32_t>::const_iterator vc_it = ne_alias.VertexCount.begin(); vc_it != ne_alias.VertexCount.end(); vc_it++)
        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("TriangleStripSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("TriangleStripSet");

			MACRO_NODECHECK_LOOPEND("TriangleStripSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}